

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.h
# Opt level: O0

bool __thiscall
vo::OpticalFlowPatch<float,_vo::Pattern51<float>_>::residual
          (OpticalFlowPatch<float,_vo::Pattern51<float>_> *this,Image<const_unsigned_short> *img,
          Matrix2P *transformed_pattern,VectorP *residual)

{
  int iVar1;
  Matrix2P *pMVar2;
  bool bVar3;
  Scalar *pSVar4;
  CoeffReturnType pfVar5;
  float fVar6;
  float fVar7;
  int local_b0;
  float val;
  int i_1;
  int num_residuals;
  Matrix<float,_2,_1,_0,_2,_1> local_78;
  ConstColXpr local_70;
  int local_3c;
  int local_38;
  int i;
  int num_valid_points;
  float sum;
  VectorP *residual_local;
  Matrix2P *transformed_pattern_local;
  Image<const_unsigned_short> *img_local;
  OpticalFlowPatch<float,_vo::Pattern51<float>_> *this_local;
  
  i = 0;
  local_38 = 0;
  _num_valid_points = (DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1> *)residual;
  residual_local = (VectorP *)transformed_pattern;
  transformed_pattern_local = (Matrix2P *)img;
  img_local = (Image<const_unsigned_short> *)this;
  for (local_3c = 0; pMVar2 = transformed_pattern_local, iVar1 = i, local_3c < 0x34;
      local_3c = local_3c + 1) {
    Eigen::DenseBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>::col
              (&local_70,(DenseBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_> *)residual_local,
               (long)local_3c);
    bVar3 = Image<unsigned_short_const>::
            InBounds<Eigen::Block<Eigen::Matrix<float,2,52,0,2,52>const,2,1,true>>
                      ((Image<unsigned_short_const> *)pMVar2,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_2,_1,_true>_>
                        *)&local_70,2.0);
    pMVar2 = transformed_pattern_local;
    if (bVar3) {
      Eigen::DenseBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>::col
                ((ConstColXpr *)&i_1,
                 (DenseBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_> *)residual_local,(long)local_3c)
      ;
      Eigen::Matrix<float,2,1,0,2,1>::
      Matrix<Eigen::Block<Eigen::Matrix<float,2,52,0,2,52>const,2,1,true>>
                ((Matrix<float,2,1,0,2,1> *)&local_78,
                 (EigenBase<Eigen::Block<const_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_2,_1,_true>_>
                  *)&i_1);
      fVar6 = Image<const_unsigned_short>::interp<float>
                        ((Image<const_unsigned_short> *)pMVar2,&local_78);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                         (_num_valid_points,(long)local_3c);
      *pSVar4 = fVar6;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                         (_num_valid_points,(long)local_3c);
      i = (int)(*pSVar4 + (float)i);
      local_38 = local_38 + 1;
    }
    else {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                         (_num_valid_points,(long)local_3c);
      *pSVar4 = -1.0;
    }
  }
  fVar6 = std::numeric_limits<float>::epsilon();
  if (fVar6 <= (float)iVar1) {
    val = 0.0;
    for (local_b0 = 0; local_b0 < 0x34; local_b0 = local_b0 + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                         (_num_valid_points,(long)local_b0);
      if (*pSVar4 < 0.0) {
LAB_002fabd9:
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                           (_num_valid_points,(long)local_b0);
        *pSVar4 = 0.0;
      }
      else {
        pfVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0> *)&this->data
                            ,(long)local_b0);
        if (*pfVar5 < 0.0) goto LAB_002fabd9;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                           (_num_valid_points,(long)local_b0);
        fVar7 = ((float)local_38 * *pSVar4) / (float)i;
        pfVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0> *)&this->data
                            ,(long)local_b0);
        fVar6 = *pfVar5;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                           (_num_valid_points,(long)local_b0);
        *pSVar4 = fVar7 - fVar6;
        val = (float)((int)val + 1);
      }
    }
    this_local._7_1_ = 0x1a < (int)val;
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_> *)_num_valid_points);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool residual(const Image<const uint16_t> &img,
                       const Matrix2P &transformed_pattern,
                       VectorP &residual) const {
    Scalar sum = 0;
    int num_valid_points = 0;

    for (int i = 0; i < PATTERN_SIZE; i++) {
      if (img.InBounds(transformed_pattern.col(i), 2)) {
        residual[i] = img.interp<Scalar>(transformed_pattern.col(i));
        sum += residual[i];
        num_valid_points++;
      } else {
        residual[i] = -1;
      }
    }

    // all-black patch cannot be normalized
    if (sum < std::numeric_limits<Scalar>::epsilon()) {
      residual.setZero();
      return false;
    }

    int num_residuals = 0;

    for (int i = 0; i < PATTERN_SIZE; i++) {
      if (residual[i] >= 0 && data[i] >= 0) {
        const Scalar val = residual[i];
        residual[i] = num_valid_points * val / sum - data[i];
        num_residuals++;

      } else {
        residual[i] = 0;
      }
    }

    return num_residuals > PATTERN_SIZE / 2;
  }